

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

XmlWriter * __thiscall
doctest::anon_unknown_14::XmlWriter::writeAttribute(XmlWriter *this,string *name,char *attribute)

{
  ulong uVar1;
  ostream *poVar2;
  string *str;
  XmlEncode *in_RDX;
  string *in_RSI;
  XmlWriter *in_RDI;
  XmlEncode *in_stack_ffffffffffffff58;
  ostream *in_stack_ffffffffffffff60;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  uVar1 = std::__cxx11::string::empty();
  if ((((uVar1 & 1) == 0) && (in_RDX != (XmlEncode *)0x0)) &&
     ((in_RDX->m_str)._M_dataplus != (_Alloc_hider)0x0)) {
    poVar2 = std::operator<<(in_RDI->m_os,' ');
    poVar2 = std::operator<<(poVar2,in_RSI);
    str = (string *)std::operator<<(poVar2,"=\"");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    XmlEncode::XmlEncode(in_RDX,str,(ForWhat)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    poVar2 = anon_unknown_14::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::operator<<(poVar2,'\"');
    XmlEncode::~XmlEncode((XmlEncode *)0x120fa4);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  }
  return in_RDI;
}

Assistant:

XmlWriter& XmlWriter::writeAttribute( std::string const& name, const char* attribute ) {
        if( !name.empty() && attribute && attribute[0] != '\0' )
            m_os << ' ' << name << "=\"" << XmlEncode( attribute, XmlEncode::ForAttributes ) << '"';
        return *this;
    }